

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFx.c
# Opt level: O0

int Tab_TabHashAdd(Tab_Tab_t *p,int *pLits,int Func,int Cost)

{
  int iVar1;
  Tab_Obj_t *pTVar2;
  int iVar3;
  Tab_Obj_t *pTVar4;
  Tab_Obj_t *pBin;
  Tab_Obj_t *pEnt;
  int Cost_local;
  int Func_local;
  int *pLits_local;
  Tab_Tab_t *p_local;
  
  if (p->nBins == p->SizeMask + 1) {
    Tab_TabRehash(p);
  }
  if (p->nBins < p->SizeMask + 1) {
    pTVar4 = p->pBins;
    iVar3 = Tab_Hash(*pLits,pLits[1],pLits[2],Func,p->SizeMask);
    pTVar4 = pTVar4 + iVar3;
    pBin = Tab_TabEntry(p,pTVar4->Table);
    while( true ) {
      if (pBin == (Tab_Obj_t *)0x0) {
        pTVar2 = p->pBins;
        iVar3 = p->nBins;
        *(ulong *)&pTVar2[iVar3].field_0x8 =
             *(ulong *)&pTVar2[iVar3].field_0x8 & 0xffffffff0001ffff |
             ((ulong)(uint)*pLits & 0x7fff) << 0x11;
        *(ulong *)&pTVar2[iVar3].field_0x8 =
             *(ulong *)&pTVar2[iVar3].field_0x8 & 0xffff8000ffffffff |
             ((ulong)(uint)pLits[1] & 0x7fff) << 0x20;
        *(ulong *)&pTVar2[iVar3].field_0x8 =
             *(ulong *)&pTVar2[iVar3].field_0x8 & 0xc0007fffffffffff |
             ((ulong)(uint)pLits[2] & 0x7fff) << 0x2f;
        *(ulong *)&pTVar2[iVar3].field_0x8 =
             *(ulong *)&pTVar2[iVar3].field_0x8 & 0x3fffffffffffffff | (ulong)(uint)Func << 0x3e;
        *(ulong *)&pTVar2[iVar3].field_0x8 =
             *(ulong *)&pTVar2[iVar3].field_0x8 & 0xfffffffffffe0000 | (ulong)(uint)Cost & 0x1ffff;
        pTVar2[iVar3].Next = pTVar4->Table;
        iVar1 = p->nBins;
        p->nBins = iVar1 + 1;
        pTVar4->Table = iVar1;
        if ((pTVar2[iVar3].Next != 0) && (pTVar2[iVar3].Next == pTVar4->Table)) {
          __assert_fail("!pEnt->Next || pEnt->Next != pBin->Table",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                        ,0x95,"int Tab_TabHashAdd(Tab_Tab_t *, int *, int, int)");
        }
        return 0;
      }
      if ((((((uint)(*(ulong *)&pBin->field_0x8 >> 0x11) & 0x7fff) == *pLits) &&
           (((uint)((ulong)*(undefined8 *)&pBin->field_0x8 >> 0x20) & 0x7fff) == pLits[1])) &&
          (((uint)((ulong)*(undefined8 *)&pBin->field_0x8 >> 0x2f) & 0x7fff) == pLits[2])) &&
         ((uint)((ulong)*(undefined8 *)&pBin->field_0x8 >> 0x3e) == Func)) break;
      pBin = Tab_TabEntry(p,pBin->Next);
    }
    *(ulong *)&pBin->field_0x8 =
         *(ulong *)&pBin->field_0x8 & 0xfffffffffffe0000 |
         (ulong)(((uint)*(undefined8 *)&pBin->field_0x8 & 0x1ffff) + Cost) & 0x1ffff;
    return 1;
  }
  __assert_fail("p->nBins < p->SizeMask + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFx.c"
                ,0x87,"int Tab_TabHashAdd(Tab_Tab_t *, int *, int, int)");
}

Assistant:

static inline int         Tab_TabHashAdd( Tab_Tab_t * p, int * pLits, int Func, int Cost )
{
    if ( p->nBins == p->SizeMask + 1 )
        Tab_TabRehash( p );
    assert( p->nBins < p->SizeMask + 1 );
    {
        Tab_Obj_t * pEnt, * pBin = p->pBins + Tab_Hash(pLits[0], pLits[1], pLits[2], Func, p->SizeMask);
        for ( pEnt = Tab_TabEntry(p, pBin->Table); pEnt; pEnt = Tab_TabEntry(p, pEnt->Next) )
            if ( (int)pEnt->LitA == pLits[0] && (int)pEnt->LitB == pLits[1] && (int)pEnt->LitC == pLits[2] && (int)pEnt->Func == Func )
                {  pEnt->Cost += Cost; return 1; }
        pEnt = p->pBins + p->nBins;
        pEnt->LitA  = pLits[0];
        pEnt->LitB  = pLits[1];
        pEnt->LitC  = pLits[2];
        pEnt->Func  = Func;
        pEnt->Cost  = Cost;
        pEnt->Next  = pBin->Table;
        pBin->Table = p->nBins++;
        assert( !pEnt->Next || pEnt->Next != pBin->Table );
        return 0;
    }
}